

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_iostream.h
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
operator>>(basic_istream<char,_std::char_traits<char>_> *stream,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> stl_string;
  
  stl_string._M_dataplus._M_p = (pointer)&stl_string.field_2;
  stl_string._M_string_length = 0;
  stl_string.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)stream,(string *)&stl_string);
  ST::string::set(str,stl_string._M_dataplus._M_p,stl_string._M_string_length,check_validity);
  std::__cxx11::string::~string((string *)&stl_string);
  return stream;
}

Assistant:

std::basic_istream<char_T, traits_T> &operator>>(
        std::basic_istream<char_T, traits_T> &stream ST_LIFETIME_BOUND,
        ST::string &str)
{
    std::basic_string<char_T, traits_T> stl_string;
    stream >> stl_string;
    str.set(stl_string.c_str(), stl_string.size());
    return stream;
}